

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O1

HalfCycles __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::
perform_bus_operation<CPU::MC68000::Microcycle<325u>>
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this,
          Microcycle<325U> *cycle,int param_2)

{
  atomic_flag *paVar1;
  __atomic_flag_data_type _Var2;
  uint uVar3;
  byte bVar4;
  HalfCycles HVar5;
  uint uVar7;
  size_t __nbytes;
  long lVar8;
  uint *__buf;
  uint *extraout_RDX;
  uint uVar9;
  uint8_t *puVar10;
  uint32_t uVar11;
  WrappedInt<HalfCycles> duration;
  ssize_t sVar6;
  
  advance_time(this,(HalfCycles)(cycle->length).super_WrappedInt<HalfCycles>.length_);
  uVar7 = *cycle->address;
  __nbytes = (size_t)uVar7;
  uVar9 = uVar7 & 0xffffff;
  (this->mc68000_).super_ProcessorBase.vpa_ = 0xdfffff < uVar9;
  uVar3 = *(uint *)((long)this->memory_map_ + (ulong)(uVar7 >> 0xf & 0x1fc));
  if (8 < uVar3) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/Macintosh.cpp"
                  ,0xe4,
                  "HalfCycles Apple::Macintosh::ConcreteMachine<Analyser::Static::Macintosh::Target::Model::MacPlus>::perform_bus_operation(const Microcycle &, int) [model = Analyser::Static::Macintosh::Target::Model::MacPlus, Microcycle = CPU::MC68000::Microcycle<325>]"
                 );
  }
  __buf = &switchD_002db1b8::switchdataD_004bdf28;
  switch(uVar3) {
  case 0:
    if (this->ram_mask_ - 0xd900 < (uVar9 ^ 1)) {
      HVar5.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_;
      (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ = 0;
      Macintosh::Video::run_for(&this->video_,HVar5);
      HVar5 = Macintosh::Video::next_sequence_point(&this->video_);
      (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_ =
           (IntType)HVar5.super_WrappedInt<HalfCycles>.length_;
    }
    puVar10 = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar11 = this->ram_mask_;
    lVar8 = (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ % 0x3f980 +
            (this->video_).frame_position_.super_WrappedInt<HalfCycles>.length_;
    duration.length_ = 0;
    if ((lVar8 % 0x2c0 < 0x200) && ((int)(lVar8 / 0x2c0) < 0x156)) {
      if ((long)this->ram_subcycle_ < 8) {
        duration.length_ = 8 - (long)this->ram_subcycle_;
        advance_time(this,(HalfCycles)duration.length_);
      }
      else {
        duration.length_ = 0;
      }
    }
    goto LAB_002db39b;
  case 1:
    uVar11 = this->rom_mask_;
    puVar10 = this->rom_;
    duration.length_ = 0;
LAB_002db39b:
    (cycle->value->field_1).b = puVar10[uVar11 & (uVar9 ^ 1)];
    return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
  case 2:
    if ((uVar7 & 1) != 0) goto switchD_002db1b8_caseD_8;
    sVar6 = MOS::MOS6522::
            MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
            ::read(&this->via_,uVar9 >> 9,&switchD_002db1b8::switchdataD_004bdf28,__nbytes);
    bVar4 = (byte)sVar6;
    break;
  case 3:
    if ((uVar7 & 1) != 0) {
      LOCK();
      paVar1 = &(this->iwm_).flush_concurrency_check_;
      _Var2 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var2 != false) {
        __assert_fail("!flush_concurrency_check_.test_and_set()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/../../../ClockReceiver/JustInTime.hpp"
                      ,0x7e,
                      "auto JustInTimeActor<Apple::IWM>::operator->() [T = Apple::IWM, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                     );
      }
      if ((this->iwm_).is_flushed_ == false) {
        (this->iwm_).is_flushed_ = true;
        (this->iwm_).did_flush_ = true;
        lVar8 = (this->iwm_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
        (this->iwm_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
             (ulong)((uint)lVar8 & 1);
        IWM::run_for(&(this->iwm_).object_,(Cycles)(lVar8 >> 1));
        __buf = extraout_RDX;
      }
      LOCK();
      (this->iwm_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
      UNLOCK();
      sVar6 = IWM::read(&(this->iwm_).object_,uVar9 >> 9,__buf,__nbytes);
      (cycle->value->field_1).b = (byte)(0xff << (((byte)*cycle->address & 1) << 3)) | (byte)sVar6;
      return (HalfCycles)0;
    }
  case 8:
switchD_002db1b8_caseD_8:
    (cycle->value->field_1).b = 0xff;
    return (HalfCycles)0;
  case 4:
    if ((uVar7 & 1) != 0) {
      Zilog::SCC::z8530::write(&this->scc_,uVar9 >> 1,(void *)0xff,__nbytes);
    }
    goto switchD_002db1b8_caseD_8;
  case 5:
    if ((uVar7 & 1) != 0) {
      Zilog::SCC::z8530::reset(&this->scc_);
      goto switchD_002db1b8_caseD_8;
    }
    sVar6 = Zilog::SCC::z8530::read
                      (&this->scc_,uVar9 >> 1,&switchD_002db1b8::switchdataD_004bdf28,__nbytes);
    bVar4 = (byte)sVar6;
    break;
  case 6:
    if ((uVar7 & 1) != 0) {
      NCR::NCR5380::NCR5380::write(&this->scsi_,uVar9 >> 4,(void *)0xff,(ulong)(uVar7 >> 9 & 1));
      return (HalfCycles)0;
    }
    uVar7 = uVar7 >> 9 & 1;
    sVar6 = NCR::NCR5380::NCR5380::read(&this->scsi_,uVar9 >> 4,(void *)(ulong)uVar7,(ulong)uVar7);
    bVar4 = (byte)sVar6;
    break;
  case 7:
    (cycle->value->field_1).b = (byte)(0xff << ((byte)(uVar7 << 3) & 8)) | (byte)this->phase_ & 7;
    return (HalfCycles)0;
  }
  (cycle->value->field_1).b = (byte)(0xff00 >> (((byte)*cycle->address & 1) << 3)) | bVar4;
  return (HalfCycles)0;
}

Assistant:

HalfCycles perform_bus_operation(const Microcycle &cycle, int) {
			// Advance time.
			advance_time(cycle.length);

			// A null cycle leaves nothing else to do.
			if(!(cycle.operation & (CPU::MC68000::Operation::NewAddress | CPU::MC68000::Operation::SameAddress))) return HalfCycles(0);

			// Grab the address.
			auto address = cycle.host_endian_byte_address();

			// Everything above E0 0000 is signalled as being on the peripheral bus.
			//
			// This will also act to autovector interrupts, since an interrupt acknowledge
			// cycle posts an address with all the higher-order bits set, and VPA doubles
			// as the input to request an autovector.
			mc68000_.set_is_peripheral_address(address >= 0xe0'0000);

			// All code below deals only with reads and writes — cycles in which a
			// data select is active. So quit now if this is not the active part of
			// a read or write.
			//
			// The 68000 uses 6800-style autovectored interrupts, so the mere act of
			// having set VPA above deals with those given that the generated address
			// for interrupt acknowledge cycles always has all bits set except the
			// lowest explicit address lines.
			if(
				!cycle.data_select_active() ||
				(cycle.operation & CPU::MC68000::Operation::InterruptAcknowledge)
			) return HalfCycles(0);

			// Grab the word-precision address being accessed.
			uint8_t *memory_base = nullptr;
			HalfCycles delay;
			switch(memory_map_[address >> 17]) {
				default: assert(false);

				case BusDevice::Unassigned:
					fill_unmapped(cycle);
				return delay;

				case BusDevice::VIA: {
					if(*cycle.address & 1) {
						fill_unmapped(cycle);
					} else {
						const int register_address = address >> 9;

						// VIA accesses are via address 0xefe1fe + register*512,
						// which at word precision is 0x77f0ff + register*256.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(via_.read(register_address));
						} else {
							via_.write(register_address, cycle.value8_high());
						}
					}
				} return delay;

				case BusDevice::PhaseRead: {
					if(cycle.operation & CPU::MC68000::Operation::Read) {
						cycle.set_value8_low(phase_ & 7);
					}
				} return delay;

				case BusDevice::IWM: {
					if(*cycle.address & 1) {
						const int register_address = address >> 9;

						// The IWM; this is a purely polled device, so can be run on demand.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_low(iwm_->read(register_address));
						} else {
							iwm_->write(register_address, cycle.value8_low());
						}
					} else {
						fill_unmapped(cycle);
					}
				} return delay;

				case BusDevice::SCSI: {
					const int register_address = address >> 4;
					const bool dma_acknowledge = address & 0x200;

					// Even accesses = read; odd = write.
					if(*cycle.address & 1) {
						// Odd access => this is a write. Data will be in the upper byte.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							scsi_.write(register_address, 0xff, dma_acknowledge);
						} else {
							scsi_.write(register_address, cycle.value8_high());
						}
					} else {
						// Even access => this is a read.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(scsi_.read(register_address, dma_acknowledge));
						}
					}
				} return delay;

				case BusDevice::SCCReadResetPhase: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// A0 = 1 => reset; A0 = 0 => read.
						if(*cycle.address & 1) {
							scc_.reset();

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value16(0xffff);
							}
						} else {
							const auto read = scc_.read(int(address >> 1));
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value8_high(read);
							}
						}
					}
				} return delay;

				case BusDevice::SCCWrite: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// This is definitely a byte access; either it's to an odd address, in which
						// case it will reach the SCC, or it isn't, in which case it won't.
						if(*cycle.address & 1) {
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								scc_.write(int(address >> 1), 0xff);
								cycle.value->b = 0xff;
							} else {
								scc_.write(int(address >> 1), cycle.value->b);
							}
						} else {
							fill_unmapped(cycle);
						}
					}
				} return delay;

				case BusDevice::RAM: {
					// This is coupled with the Macintosh implementation of video; the magic
					// constant should probably be factored into the Video class.
					// It embodies knowledge of the fact that video (and audio) will always
					// be fetched from the final $d900 bytes of memory.
					// (And that ram_mask_ = ram size - 1).
					if(address > ram_mask_ - 0xd900)
						update_video();

					memory_base = ram_.data();
					address &= ram_mask_;

					// Apply a delay due to video contention if applicable; scheme applied:
					// only every other access slot is available during the period of video
					// output. I believe this to be correct for the 128k, 512k and Plus.
					// More research to do on other models.
					if(video_is_outputting() && ram_subcycle_ < 8) {
						delay = HalfCycles(8 - ram_subcycle_);
						advance_time(delay);
					}
				} break;

				case BusDevice::ROM: {
					if(!(cycle.operation & CPU::MC68000::Operation::Read)) return delay;
					memory_base = rom_;
					address &= rom_mask_;
				} break;
			}

			// If control has fallen through to here, the access is either a read from ROM, or a read or write to RAM.
			// Potential writes to ROM and all hardware accesses have already been weeded out.
			cycle.apply(&memory_base[address]);

			return delay;
		}